

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O1

size_t FSE_readNCount_bmi2(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,
                          void *headerBuffer,size_t hbSize,int bmi2)

{
  uint *puVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint *puVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar18;
  uint *puVar19;
  bool bVar20;
  char buffer [8];
  undefined8 local_38;
  int iVar17;
  
  if (hbSize < 8) {
    local_38 = 0;
    memcpy(&local_38,headerBuffer,hbSize);
    sVar3 = FSE_readNCount_bmi2(normalizedCounter,maxSVPtr,tableLogPtr,&local_38,8,bmi2);
    sVar4 = 0xffffffffffffffec;
    if (sVar3 <= hbSize) {
      sVar4 = sVar3;
    }
    if (0xffffffffffffff88 < sVar3) {
      sVar4 = sVar3;
    }
  }
  else {
    uVar7 = *maxSVPtr + 1;
    memset(normalizedCounter,0,(ulong)uVar7 * 2);
    uVar10 = *headerBuffer & 0xf;
    sVar4 = 0xffffffffffffffd4;
    if (uVar10 < 0xb) {
      uVar15 = *headerBuffer >> 4;
      *tableLogPtr = uVar10 + 5;
      iVar14 = 0x20 << (sbyte)uVar10;
      uVar16 = iVar14 + 1;
      iVar11 = uVar10 + 6;
      puVar1 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar19 = (uint *)((long)headerBuffer + (hbSize - 4));
      bVar20 = true;
      uVar10 = 4;
      uVar13 = 0;
      puVar12 = (uint *)headerBuffer;
      do {
        if (!bVar20) {
          uVar18 = 0;
          if ((~uVar15 | 0x80000000) != 0) {
            for (; ((~uVar15 | 0x80000000) >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
            }
          }
          while (0x17 < uVar18) {
            if (puVar1 < puVar12) {
              uVar10 = uVar10 + ((int)puVar12 - (int)puVar1) * 8 & 0x1f;
              puVar12 = puVar19;
            }
            else {
              puVar12 = (uint *)((long)puVar12 + 3);
            }
            uVar15 = *puVar12 >> ((byte)uVar10 & 0x1f);
            uVar18 = 0;
            if ((~uVar15 | 0x80000000) != 0) {
              for (; ((~uVar15 | 0x80000000) >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar13 = uVar13 + 0x24;
          }
          uVar15 = uVar15 >> ((byte)(uVar18 & 0xfffffffe) & 0x1f);
          uVar13 = (uVar15 & 3) + (uVar18 >> 1) * 3 + uVar13;
          uVar10 = uVar10 + (uVar18 & 0xfffffffe) + 2;
          if (uVar13 < uVar7) {
            iVar9 = (int)uVar10 >> 3;
            if ((puVar1 < puVar12) && (puVar19 < (uint *)((long)iVar9 + (long)puVar12))) {
              uVar10 = uVar10 + ((int)puVar12 - (int)puVar19) * 8 & 0x1f;
              puVar12 = puVar19;
            }
            else {
              uVar10 = uVar10 & 7;
              puVar12 = (uint *)((long)puVar12 + (long)iVar9);
            }
            uVar15 = *puVar12 >> (sbyte)uVar10;
          }
          if (uVar7 <= uVar13) break;
        }
        uVar18 = iVar14 * 2 - 1;
        uVar8 = uVar18 - uVar16;
        uVar5 = iVar14 - 1U & uVar15;
        if (uVar5 < uVar8) {
          iVar9 = iVar11 + -1;
        }
        else {
          uVar18 = uVar18 & uVar15;
          if ((int)uVar18 < iVar14) {
            uVar8 = 0;
          }
          uVar5 = uVar18 - uVar8;
          iVar9 = iVar11;
        }
        uVar10 = iVar9 + uVar10;
        iVar9 = uVar5 - 1;
        iVar17 = 1 - uVar5;
        if ((int)uVar5 < 1) {
          iVar17 = iVar9;
        }
        uVar16 = iVar17 + uVar16;
        uVar6 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
        normalizedCounter[uVar6] = (short)iVar9;
        bVar20 = iVar9 != 0;
        if ((int)uVar16 < iVar14) {
          if (1 < (int)uVar16) {
            uVar18 = 0x1f;
            if (uVar16 != 0) {
              for (; uVar16 >> uVar18 == 0; uVar18 = uVar18 - 1) {
              }
            }
            iVar11 = (uVar18 ^ 0xffffffe0) + 0x21;
            iVar14 = 1 << ((byte)uVar18 & 0x1f);
            goto LAB_006ad254;
          }
LAB_006ad278:
          bVar2 = false;
        }
        else {
LAB_006ad254:
          if (uVar7 <= uVar13) goto LAB_006ad278;
          iVar9 = (int)uVar10 >> 3;
          if ((puVar1 < puVar12) && (puVar19 < (uint *)((long)iVar9 + (long)puVar12))) {
            uVar10 = uVar10 + ((int)puVar12 - (int)puVar19) * 8 & 0x1f;
            puVar12 = puVar19;
          }
          else {
            uVar10 = uVar10 & 7;
            puVar12 = (uint *)((long)puVar12 + (long)iVar9);
          }
          uVar15 = *puVar12 >> (sbyte)uVar10;
          bVar2 = true;
        }
      } while (bVar2);
      sVar4 = 0xffffffffffffffec;
      if (((uVar16 == 1) && (sVar4 = 0xffffffffffffffd0, uVar13 <= uVar7)) &&
         (sVar4 = 0xffffffffffffffec, (int)uVar10 < 0x21)) {
        *maxSVPtr = uVar13 - 1;
        sVar4 = (long)puVar12 + ((long)((int)(uVar10 + 7) >> 3) - (long)headerBuffer);
      }
    }
  }
  return sVar4;
}

Assistant:

size_t FSE_readNCount_bmi2(
        short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
        const void* headerBuffer, size_t hbSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_readNCount_body_bmi2(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
    }
#endif
    (void)bmi2;
    return FSE_readNCount_body_default(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
}